

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O1

void __thiscall mjs::anon_unknown_46::stringify_state::nest::~nest(nest *this)

{
  pointer pwVar1;
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  
  this_00 = (gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_> *)
            gc_heap_ptr_untyped::get(&(this->state_->stack_).super_gc_heap_ptr_untyped);
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>::pop_back(this_00);
  std::__cxx11::wstring::_M_assign((wstring *)&this->state_->indent_);
  pwVar1 = (this->step_back_)._M_dataplus._M_p;
  paVar2 = &(this->step_back_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar1 != paVar2) {
    operator_delete(pwVar1,paVar2->_M_allocated_capacity * 4 + 4);
    return;
  }
  return;
}

Assistant:

~nest() {
            state_.pop();
            state_.indent_ = step_back_;
        }